

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

void p_bre(parse *p,int end1,int end2)

{
  int *piVar1;
  size_t opnd;
  long lVar2;
  re_guts *prVar3;
  long start;
  byte *pbVar4;
  long lVar5;
  sopno finish;
  size_t sVar6;
  bool bVar7;
  uint uVar8;
  int from;
  int to;
  ushort **ppuVar9;
  char *pcVar10;
  char *pcVar11;
  ulong opnd_00;
  uint uVar12;
  char *pcVar13;
  bool bVar14;
  
  pcVar13 = p->next;
  lVar2 = p->slen;
  if ((pcVar13 < p->end) && (*pcVar13 == '^')) {
    p->next = pcVar13 + 1;
    doemit(p,0xc000000,0);
    prVar3 = p->g;
    piVar1 = &prVar3->iflags;
    *piVar1 = *piVar1 | 1;
    piVar1 = &prVar3->nbol;
    *piVar1 = *piVar1 + 1;
  }
  pcVar13 = p->next;
  pcVar10 = p->end;
  if (pcVar13 < pcVar10) {
    bVar14 = false;
    bVar7 = false;
    do {
      pcVar11 = pcVar13 + 1;
      if (((pcVar11 < pcVar10) && (*pcVar13 == end1)) && (*pcVar11 == end2)) break;
      start = p->slen;
      p->next = pcVar11;
      uVar12 = (uint)*pcVar13;
      if (uVar12 == 0x5c) {
        if (pcVar10 <= pcVar11) {
          if (p->error == 0) {
            p->error = 5;
          }
          p->next = nuls;
          p->end = nuls;
        }
        pbVar4 = (byte *)p->next;
        p->next = (char *)(pbVar4 + 1);
        uVar12 = *pbVar4 | 0x100;
      }
      if ((int)uVar12 < 0x131) {
        if ((int)uVar12 < 0x5b) {
          if (uVar12 == 0x2a) {
            if (bVar7) {
              if (p->error == 0) {
                p->error = 0xd;
              }
              p->next = nuls;
              p->end = nuls;
            }
          }
          else if (uVar12 == 0x2e) {
            if ((p->g->cflags & 8) == 0) {
              doemit(p,0x14000000,0);
            }
            else {
              nonnewline(p);
            }
            goto LAB_0010459b;
          }
LAB_001044a4:
          ordinary(p,(int)(char)uVar12);
        }
        else if (uVar12 == 0x5b) {
          p_bracket(p);
        }
        else {
          if (uVar12 != 0x128) {
            if (uVar12 == 0x129) goto LAB_0010444f;
            goto LAB_001044a4;
          }
          sVar6 = p->g->nsub;
          opnd = sVar6 + 1;
          p->g->nsub = opnd;
          if ((long)opnd < 10) {
            p->pbegin[sVar6 + 1] = start;
          }
          doemit(p,0x34000000,opnd);
          pcVar13 = p->next;
          if ((pcVar13 < p->end) &&
             (((p->end <= pcVar13 + 1 || (*pcVar13 != '\\')) || (pcVar13[1] != ')')))) {
            p_bre(p,0x5c,0x29);
          }
          if (((long)opnd < 10) && (lVar5 = p->slen, p->pend[sVar6 + 1] = lVar5, lVar5 == 0)) {
            __assert_fail("p->pend[subno] != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x1f8,"int p_simp_re()");
          }
          doemit(p,0x38000000,opnd);
          pcVar13 = p->next;
          if ((((p->end <= pcVar13) || (p->end <= pcVar13 + 1)) || (*pcVar13 != '\\')) ||
             (pcVar13[1] != ')')) {
            if (p->error != 0) goto LAB_00104594;
            goto LAB_0010458d;
          }
          p->next = pcVar13 + 2;
        }
      }
      else if (uVar12 - 0x131 < 9) {
        uVar8 = uVar12 & 0xfffffeff;
        if (0x39 < (int)uVar8) {
          __assert_fail("i < NPAREN",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                        ,0x20b,"int p_simp_re()");
        }
        if (*(long *)((long)p + (long)(int)uVar8 * 8 + -0xf0) == 0) {
          if (p->error == 0) {
            p->error = 6;
          }
          p->next = nuls;
          p->end = nuls;
        }
        else {
          opnd_00 = (long)(int)uVar8 - 0x30;
          if (p->g->nsub < opnd_00) {
            __assert_fail("(size_t) i <= p->g->nsub",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x20d,"int p_simp_re()");
          }
          doemit(p,0x1c000000,opnd_00);
          lVar5 = *(long *)((long)p + opnd_00 * 8 + 0x40);
          if (lVar5 == 0) {
            __assert_fail("p->pbegin[i] != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x20f,"int p_simp_re()");
          }
          if ((*(uint *)(p->strip + lVar5) & 0x7c000000) != 0x34000000) {
            __assert_fail("OP(p->strip[p->pbegin[i]]) == OLPAREN",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x210,"int p_simp_re()");
          }
          finish = *(sopno *)((long)p + opnd_00 * 8 + 0x90);
          if ((*(uint *)(p->strip + finish) & 0x7c000000) != 0x38000000) {
            __assert_fail("OP(p->strip[p->pend[i]]) == ORPAREN",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                          ,0x211,"int p_simp_re()");
          }
          dupl(p,lVar5 + 1,finish);
          doemit(p,0x20000000,opnd_00);
        }
        p->g->backrefs = 1;
      }
      else {
        if (uVar12 == 0x17b) {
          if (p->error == 0) {
            p->error = 0xd;
          }
        }
        else {
          if (uVar12 != 0x17d) goto LAB_001044a4;
LAB_0010444f:
          if (p->error == 0) {
LAB_0010458d:
            p->error = 8;
          }
        }
LAB_00104594:
        p->next = nuls;
        p->end = nuls;
      }
LAB_0010459b:
      pcVar13 = p->next;
      pcVar10 = p->end;
      if (pcVar13 < pcVar10) {
        if (*pcVar13 == '*') {
          p->next = pcVar13 + 1;
          doinsert(p,0x24000000,(p->slen - start) + 1,start);
          doemit(p,0x28000000,p->slen - start);
          doinsert(p,0x2c000000,(p->slen - start) + 1,start);
          doemit(p,0x30000000,p->slen - start);
        }
        else {
          if (((pcVar10 <= pcVar13) || (pcVar10 <= pcVar13 + 1)) ||
             ((*pcVar13 != '\\' || (pcVar13[1] != '{')))) goto LAB_001046ef;
          p->next = pcVar13 + 2;
          from = p_count(p);
          pcVar13 = p->next;
          to = from;
          if ((pcVar13 < p->end) && (*pcVar13 == ',')) {
            pcVar13 = pcVar13 + 1;
            p->next = pcVar13;
            to = 0x100;
            if ((pcVar13 < p->end) &&
               ((ppuVar9 = __ctype_b_loc(),
                (*(byte *)((long)*ppuVar9 + (long)*pcVar13 * 2 + 1) & 8) != 0 &&
                (to = p_count(p), to < from)))) {
              if (p->error == 0) {
                p->error = 10;
              }
              p->next = nuls;
              p->end = nuls;
            }
          }
          repeat(p,start,from,to);
          pcVar13 = p->next;
          pcVar10 = p->end;
          if ((((pcVar13 < pcVar10) && (pcVar13 + 1 < pcVar10)) && (*pcVar13 == '\\')) &&
             (pcVar13[1] == '}')) {
            p->next = pcVar13 + 2;
          }
          else {
            pcVar13 = p->next;
            bVar14 = pcVar13 < pcVar10;
            if (bVar14) {
              do {
                pcVar11 = pcVar13 + 1;
                if (((pcVar11 < pcVar10) && (*pcVar13 == '\\')) && (*pcVar11 == '}')) {
                  if (bVar14) goto LAB_00104761;
                  break;
                }
                p->next = pcVar11;
                bVar14 = pcVar11 < pcVar10;
                pcVar13 = pcVar11;
              } while (pcVar11 != pcVar10);
            }
            if (p->error == 0) {
              p->error = 9;
            }
            p->next = nuls;
            p->end = nuls;
LAB_00104761:
            if (p->error == 0) {
              p->error = 10;
            }
            p->next = nuls;
            p->end = nuls;
          }
        }
LAB_001046fa:
        bVar14 = false;
      }
      else {
LAB_001046ef:
        bVar14 = true;
        if (uVar12 != 0x24) goto LAB_001046fa;
      }
      pcVar13 = p->next;
      pcVar10 = p->end;
      bVar7 = true;
    } while (pcVar13 < pcVar10);
    if (bVar14) {
      p->slen = p->slen + -1;
      doemit(p,0x10000000,0);
      prVar3 = p->g;
      piVar1 = &prVar3->iflags;
      *piVar1 = *piVar1 | 2;
      piVar1 = &prVar3->neol;
      *piVar1 = *piVar1 + 1;
    }
  }
  if (p->slen == lVar2) {
    if (p->error == 0) {
      p->error = 0xe;
    }
    p->next = nuls;
    p->end = nuls;
  }
  return;
}

Assistant:

static void
p_bre(p, end1, end2)
struct parse *p;
int end1;		/* first terminating character */
int end2;		/* second terminating character */
{
	sopno start = HERE();
	int first = 1;			/* first subexpression? */
	int wasdollar = 0;

	if (EAT('^')) {
		EMIT(OBOL, 0);
		p->g->iflags |= USEBOL;
		p->g->nbol++;
	}
	while (MORE() && !SEETWO(end1, end2)) {
		wasdollar = p_simp_re(p, first);
		first = 0;
	}
	if (wasdollar) {	/* oops, that was a trailing anchor */
		DROP(1);
		EMIT(OEOL, 0);
		p->g->iflags |= USEEOL;
		p->g->neol++;
	}

	REQUIRE(HERE() != start, REG_EMPTY);	/* require nonempty */
}